

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
external_distance_sensor_message_write_read::test_method
          (external_distance_sensor_message_write_read *this)

{
  long lVar1;
  size_t i;
  undefined1 auVar2 [16];
  buffer buffer;
  buffer_writer writer;
  buffer_reader reader;
  external_distance_sensor_message write_msg;
  external_distance_sensor_message read_msg;
  undefined1 local_168 [16];
  pointer local_158;
  const_string local_150;
  char *local_140;
  char *local_138;
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_130;
  buffer_writer local_120;
  lazy_ostream local_110;
  undefined1 *local_100;
  char **local_f8;
  assertion_result local_f0;
  buffer_reader local_d8;
  double local_c0 [9];
  external_distance_sensor_message local_78;
  long lVar3;
  
  lVar1 = 0;
  auVar2 = _DAT_0017b680;
  do {
    if (SUB164(auVar2 ^ _DAT_0017b690,4) == -0x80000000 &&
        SUB164(auVar2 ^ _DAT_0017b690,0) < -0x7ffffff7) {
      local_c0[lVar1] = (double)(int)lVar1 + 0.3;
      local_c0[lVar1 + 1] = (double)((int)lVar1 + 1) + 0.3;
    }
    lVar1 = lVar1 + 2;
    lVar3 = auVar2._8_8_;
    auVar2._0_8_ = auVar2._0_8_ + 2;
    auVar2._8_8_ = lVar3 + 2;
  } while (lVar1 != 10);
  local_168 = (undefined1  [16])0x0;
  local_158 = (pointer)0x0;
  buffer_writer::buffer_writer(&local_120,(buffer *)local_168);
  local_78.data._M_elems[0]._4_1_ = EXTERNAL_DISTANCE_SENSOR;
  local_78.data._M_elems[0]._0_4_ = 0x4d;
  ::operator<<(&local_120,(message_header *)&local_78);
  lVar1 = 0;
  do {
    buffer_writer::operator<<(&local_120,*(uint8_t *)((long)local_c0 + lVar1));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x48);
  buffer_reader::buffer_reader(&local_d8,(buffer *)local_168);
  ::operator>>(&local_d8,&local_78);
  lVar1 = 0;
  do {
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1b2d70,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x184984);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb4;
    local_130.m_lhs.m_value = local_78.data._M_elems + lVar1;
    local_130.m_rhs = (double *)((long)local_c0 + lVar1);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
    ::evaluate(&local_f0,&local_130,false);
    local_140 = "read_msg.data[i] == write_msg.data[i]";
    local_138 = "";
    local_110.m_empty = false;
    local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ae7e8;
    local_100 = boost::unit_test::lazy_ostream::inst;
    local_f8 = &local_140;
    local_150.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
    ;
    local_150.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_f0,&local_110,&local_150,0xb4,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x48);
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_distance_sensor_message_write_read)
{
    external_distance_sensor_message write_msg;
    for(int i = 0; i<9; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.3;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_distance_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<9; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}